

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

bool __thiscall spvtools::opt::AggressiveDCEPass::EliminateDeadFunctions(AggressiveDCEPass *this)

{
  Module *pMVar1;
  Module *pMVar2;
  size_type sVar3;
  bool bVar4;
  iterator iVar5;
  ProcessFunction mark_live;
  unordered_set<const_spvtools::opt::Function_*,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<const_spvtools::opt::Function_*>_>
  live_function_set;
  iterator local_a0;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> local_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Hashtable<const_spvtools::opt::Function_*,_const_spvtools::opt::Function_*,_std::allocator<const_spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_60;
  
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = &local_60;
  pcStack_70 = std::
               _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:757:31)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:757:31)>
             ::_M_manager;
  IRContext::ProcessReachableCallTree
            ((this->super_MemPass).super_Pass.context_,(ProcessFunction *)&local_88);
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  local_a0.iterator_._M_current =
       *(unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> **)
        &(pMVar1->functions_).
         super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
         ._M_impl;
  iVar5.iterator_._M_current = local_a0.iterator_._M_current;
  iVar5.container_ = &pMVar1->functions_;
  pMVar2 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  if ((pMVar1 == pMVar2) &&
     (local_a0.iterator_._M_current ==
      *(pointer *)
       ((long)&(pMVar2->functions_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
               ._M_impl + 8))) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      local_a0.container_ = iVar5.container_;
      local_90._M_head_impl =
           ((iVar5.iterator_._M_current._M_current)->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
           .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
      sVar3 = std::
              _Hashtable<const_spvtools::opt::Function_*,_const_spvtools::opt::Function_*,_std::allocator<const_spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&local_60,&local_90._M_head_impl);
      if (sVar3 == 0) {
        iVar5 = eliminatedeadfunctionsutil::EliminateFunction
                          ((this->super_MemPass).super_Pass.context_,&local_a0);
        bVar4 = true;
      }
      else {
        iVar5.iterator_._M_current = local_a0.iterator_._M_current + 1;
        iVar5.container_ = local_a0.container_;
      }
      local_a0.iterator_ = iVar5.iterator_._M_current;
      local_a0.container_ = iVar5.container_;
      pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    } while ((local_a0.container_ != &pMVar1->functions_) ||
            (local_a0.iterator_._M_current !=
             *(pointer *)
              ((long)&(pMVar1->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              + 8)));
  }
  local_a0 = iVar5;
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  std::
  _Hashtable<const_spvtools::opt::Function_*,_const_spvtools::opt::Function_*,_std::allocator<const_spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Function_*>,_std::hash<const_spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_60);
  return bVar4;
}

Assistant:

bool AggressiveDCEPass::EliminateDeadFunctions() {
  // Identify live functions first. Those that are not live
  // are dead.
  std::unordered_set<const Function*> live_function_set;
  ProcessFunction mark_live = [&live_function_set](Function* fp) {
    live_function_set.insert(fp);
    return false;
  };
  context()->ProcessReachableCallTree(mark_live);

  bool modified = false;
  for (auto funcIter = get_module()->begin();
       funcIter != get_module()->end();) {
    if (live_function_set.count(&*funcIter) == 0) {
      modified = true;
      funcIter =
          eliminatedeadfunctionsutil::EliminateFunction(context(), &funcIter);
    } else {
      ++funcIter;
    }
  }

  return modified;
}